

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

size_t searchCodeIndex(uint *array,size_t array_size,size_t value)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = 1;
  sVar2 = array_size - 1;
  do {
    while( true ) {
      if (sVar2 < uVar3) {
        return array_size - 1;
      }
      uVar1 = sVar2 + uVar3 >> 1;
      if (value < array[uVar1]) break;
      uVar3 = uVar1 + 1;
    }
    sVar2 = uVar1 - 1;
  } while (value < array[uVar1 - 1]);
  return sVar2;
}

Assistant:

static size_t searchCodeIndex(const unsigned* array, size_t array_size, size_t value)
{
  /*linear search implementation*/
  /*for(size_t i = 1; i < array_size; ++i) if(array[i] > value) return i - 1;
  return array_size - 1;*/

  /*binary search implementation (not that much faster) (precondition: array_size > 0)*/
  size_t left  = 1;
  size_t right = array_size - 1;
  while(left <= right)
  {
    size_t mid = (left + right) / 2;
    if(array[mid] <= value) left = mid + 1; /*the value to find is more to the right*/
    else if(array[mid - 1] > value) right = mid - 1; /*the value to find is more to the left*/
    else return mid - 1;
  }
  return array_size - 1;
}